

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

ClassObject * __thiscall LiteScript::ClassObject::operator=(ClassObject *this,ClassObject *obj)

{
  size_type sVar1;
  const_reference __x;
  uint local_1c;
  uint sz;
  uint i;
  ClassObject *obj_local;
  ClassObject *this_local;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::clear(&this->members);
  local_1c = 0;
  sVar1 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
          ::size(&obj->members);
  for (; local_1c < (uint)sVar1; local_1c = local_1c + 1) {
    __x = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
          ::operator[](&obj->members,(ulong)local_1c);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
    ::push_back(&this->members,__x);
  }
  this->ClassBase = obj->ClassBase;
  this->ScriptState = obj->ScriptState;
  return this;
}

Assistant:

LiteScript::ClassObject& LiteScript::ClassObject::operator=(const ClassObject &obj) {
    this->members.clear();
    for (unsigned int i = 0, sz = obj.members.size(); i < sz; i++)
        this->members.push_back(obj.members[i]);
    this->ClassBase = obj.ClassBase;
    this->ScriptState = obj.ScriptState;
    return *this;
}